

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O2

void __thiscall flow::IRHandler::moveAfter(IRHandler *this,BasicBlock *moveable,BasicBlock *after)

{
  _List_node_base *p_Var1;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  pointer *__ptr;
  const_iterator __position;
  _Head_base<0UL,_flow::BasicBlock_*,_false> local_18;
  
  if ((moveable->handler_ != this) || (after->handler_ != this)) {
    __assert_fail("moveable->getHandler() == this && after->getHandler() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRHandler.cc"
                  ,0x5a,"void flow::IRHandler::moveAfter(const BasicBlock *, const BasicBlock *)");
  }
  this_00 = &this->blocks_;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      local_18._M_head_impl = (BasicBlock *)__position._M_node[1]._M_next;
      break;
    }
    local_18._M_head_impl = (BasicBlock *)__position._M_node[1]._M_next;
  } while (local_18._M_head_impl != moveable);
  __position._M_node[1]._M_next = (_List_node_base *)0x0;
  std::__cxx11::
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  ::erase(this_00,__position);
  p_Var1 = (_List_node_base *)this_00;
  do {
    p_Var1 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) break;
  } while ((BasicBlock *)p_Var1[1]._M_next != after);
  std::__cxx11::
  list<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>,std::allocator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>>
  ::emplace<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>
            ((list<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>,std::allocator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>>
              *)this_00,p_Var1->_M_next,
             (unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> *)&local_18);
  if (local_18._M_head_impl != (BasicBlock *)0x0) {
    (*(code *)((_List_node_base *)((local_18._M_head_impl)->super_Value)._vptr_Value)->_M_prev)();
  }
  return;
}

Assistant:

void IRHandler::moveAfter(const BasicBlock* moveable, const BasicBlock* after) {
  assert(moveable->getHandler() == this && after->getHandler() == this);

  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                       [&](const auto& obj) { return obj.get() == moveable; });
  std::unique_ptr<BasicBlock> m = std::move(*i);
  blocks_.erase(i);

  i = std::find_if(blocks_.begin(), blocks_.end(),
                   [&](const auto& obj) { return obj.get() == after; });
  ++i;
  blocks_.insert(i, std::move(m));
}